

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O0

void copy_suite::back_inserter_copy_if(void)

{
  pointer *this;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  iterator iVar1;
  iterator iVar2;
  back_insert_iterator<vista::circular_view<int,_18446744073709551615UL>_> bVar3;
  iterator first_begin;
  iterator first_end;
  allocator<int> local_ed;
  int local_ec [3];
  iterator local_e0;
  size_type local_d8;
  undefined1 local_d0 [8];
  vector<int,_std::allocator<int>_> expect;
  allocator<int> local_79;
  int local_78 [6];
  iterator local_60;
  size_type local_58;
  undefined1 local_50 [8];
  vector<int,_std::allocator<int>_> input;
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  span.member.next = 0;
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)
             &input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(value_type (*) [4])&span.member.next);
  local_78[0] = 0x6f;
  local_78[1] = 0xde;
  local_78[2] = 0x14d;
  local_78[3] = 0x1bc;
  local_78[4] = 0x22b;
  local_60 = local_78;
  local_58 = 5;
  std::allocator<int>::allocator(&local_79);
  __l_00._M_len = local_58;
  __l_00._M_array = local_60;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_50,__l_00,&local_79);
  std::allocator<int>::~allocator(&local_79);
  iVar1 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_50);
  iVar2 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_50)
  ;
  bVar3 = std::back_inserter<vista::circular_view<int,18446744073709551615ul>>
                    ((circular_view<int,_18446744073709551615UL> *)
                     &input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::
                copy_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::back_insert_iterator<vista::circular_view<int,18446744073709551615ul>>,copy_suite::back_inserter_copy_if()::__0>
                          (iVar1._M_current,iVar2._M_current,bVar3.container);
  local_ec[0] = 0x14d;
  local_ec[1] = 0x1bc;
  local_ec[2] = 0x22b;
  local_e0 = local_ec;
  local_d8 = 3;
  std::allocator<int>::allocator(&local_ed);
  __l._M_len = local_d8;
  __l._M_array = local_e0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_d0,__l,&local_ed);
  std::allocator<int>::~allocator(&local_ed);
  this = &input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage;
  first_begin = vista::circular_view<int,_18446744073709551615UL>::begin
                          ((circular_view<int,_18446744073709551615UL> *)this);
  first_end = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)this);
  iVar1 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_d0);
  iVar2 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_d0)
  ;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x6a,"void copy_suite::back_inserter_copy_if()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar1._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar2._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_d0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_50);
  return;
}

Assistant:

void back_inserter_copy_if()
{
    int array[4] = {};
    circular_view<int> span(array);
    std::vector<int> input = { 111, 222, 333, 444, 555 };
    std::copy_if(input.begin(), input.end(), std::back_inserter(span), [](int value) { return value > 222; });
    {
        std::vector<int> expect = { 333, 444, 555 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}